

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_deviation(lysp_yang_ctx *ctx,lysp_deviation **deviations)

{
  char *pcVar1;
  ly_ctx *local_f8;
  ly_ctx *local_e8;
  ly_ctx *local_d0;
  char *local_c8;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  char *local_90;
  bool local_79;
  undefined8 *puStack_78;
  ly_bool __loop_end;
  char *p__;
  lysf_ctx fctx;
  lysp_deviation *dev;
  size_t sStack_40;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_deviation **pplStack_20;
  LY_ERR ret;
  lysp_deviation **deviations_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_20 = deviations;
  deviations_local = (lysp_deviation **)ctx;
  memset(&p__,0,0x20);
  if (deviations_local == (lysp_deviation **)0x0) {
    local_90 = (char *)0x0;
  }
  else {
    local_90 = *(char **)**(undefined8 **)
                           (deviations_local[7]->dsc +
                           (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
  }
  p__ = local_90;
  if (*pplStack_20 == (lysp_deviation *)0x0) {
    puStack_78 = (undefined8 *)malloc(0x30);
    if (puStack_78 == (undefined8 *)0x0) {
      if (deviations_local == (lysp_deviation **)0x0) {
        local_a0 = (ly_ctx *)0x0;
      }
      else {
        local_a0 = *(ly_ctx **)
                    **(undefined8 **)
                      (deviations_local[7]->dsc +
                      (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
      }
      ly_log(local_a0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_deviation");
      return LY_EMEM;
    }
    *puStack_78 = 1;
  }
  else {
    (*pplStack_20)[-1].exts = (lysp_ext_instance *)((long)&((*pplStack_20)[-1].exts)->name + 1);
    puStack_78 = (undefined8 *)
                 realloc(&(*pplStack_20)[-1].exts,(long)(*pplStack_20)[-1].exts * 0x28 + 8);
    if (puStack_78 == (undefined8 *)0x0) {
      (*pplStack_20)[-1].exts = (lysp_ext_instance *)((long)&(*pplStack_20)[-1].exts[-1].exts + 7);
      if (deviations_local == (lysp_deviation **)0x0) {
        local_98 = (ly_ctx *)0x0;
      }
      else {
        local_98 = *(ly_ctx **)
                    **(undefined8 **)
                      (deviations_local[7]->dsc +
                      (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
      }
      ly_log(local_98,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_deviation");
      return LY_EMEM;
    }
  }
  *pplStack_20 = (lysp_deviation *)(puStack_78 + 1);
  fctx.ext_set.field_2.dnodes =
       (lyd_node **)(*pplStack_20 + (long)((long)&(*pplStack_20)[-1].exts[-1].exts + 7));
  memset(fctx.ext_set.field_2.dnodes,0,0x28);
  buf._4_4_ = get_argument((lysp_yang_ctx *)deviations_local,Y_STR_ARG,(uint16_t *)0x0,
                           (char **)&word_len,&word,&stack0xffffffffffffffc0);
  if (buf._4_4_ == LY_SUCCESS) {
    if (sStack_40 == 0) {
      if (deviations_local == (lysp_deviation **)0x0) {
        local_a8 = (ly_ctx *)0x0;
      }
      else {
        local_a8 = *(ly_ctx **)
                    **(undefined8 **)
                      (deviations_local[7]->dsc +
                      (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
      }
      ly_log(local_a8,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
             "deviation");
    }
    if (word == (char *)0x0) {
      if (deviations_local == (lysp_deviation **)0x0) {
        local_b8 = (ly_ctx *)0x0;
      }
      else {
        local_b8 = *(ly_ctx **)
                    **(undefined8 **)
                      (deviations_local[7]->dsc +
                      (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
      }
      if (sStack_40 == 0) {
        local_c8 = "";
      }
      else {
        local_c8 = (char *)word_len;
      }
      buf._4_4_ = lydict_insert(local_b8,local_c8,sStack_40,(char **)fctx.ext_set.field_2.dnodes);
    }
    else {
      if (deviations_local == (lysp_deviation **)0x0) {
        local_b0 = (ly_ctx *)0x0;
      }
      else {
        local_b0 = *(ly_ctx **)
                    **(undefined8 **)
                      (deviations_local[7]->dsc +
                      (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
      }
      buf._4_4_ = lydict_insert_zc(local_b0,(char *)word_len,(char **)fctx.ext_set.field_2.dnodes);
    }
    if (buf._4_4_ == LY_SUCCESS) {
      buf._4_4_ = 0;
      buf._4_4_ = get_keyword((lysp_yang_ctx *)deviations_local,(ly_stmt *)((long)&dev + 4),
                              (char **)&word_len,&stack0xffffffffffffffc0);
      if (buf._4_4_ == LY_SUCCESS) {
        if (dev._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
          local_79 = true;
        }
        else {
          if (dev._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
            if (deviations_local == (lysp_deviation **)0x0) {
              local_d0 = (ly_ctx *)0x0;
            }
            else {
              local_d0 = *(ly_ctx **)
                          **(undefined8 **)
                            (deviations_local[7]->dsc +
                            (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
            }
            pcVar1 = lyplg_ext_stmt2str(dev._4_4_);
            ly_vlog(local_d0,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar1);
            buf._4_4_ = LY_EVALID;
            goto LAB_001cb6f5;
          }
          buf._4_4_ = get_keyword((lysp_yang_ctx *)deviations_local,(ly_stmt *)((long)&dev + 4),
                                  (char **)&word_len,&stack0xffffffffffffffc0);
          if (buf._4_4_ != LY_SUCCESS) goto LAB_001cb6f5;
          local_79 = dev._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        while (!local_79) {
          if (dev._4_4_ == LY_STMT_DESCRIPTION) {
            buf._4_4_ = parse_text_field((lysp_yang_ctx *)deviations_local,
                                         fctx.ext_set.field_2.dnodes[1],LY_STMT_DESCRIPTION,0,
                                         (char **)(fctx.ext_set.field_2.dnodes + 1),Y_STR_ARG,
                                         (uint16_t *)0x0,
                                         (lysp_ext_instance **)(fctx.ext_set.field_2.dnodes + 4));
          }
          else if (dev._4_4_ == LY_STMT_DEVIATE) {
            buf._4_4_ = parse_deviate((lysp_yang_ctx *)deviations_local,
                                      (lysp_deviate **)(fctx.ext_set.field_2.dnodes + 3));
          }
          else if (dev._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
            buf._4_4_ = parse_ext((lysp_yang_ctx *)deviations_local,(char *)word_len,sStack_40,
                                  fctx.ext_set.field_2.dnodes,LY_STMT_DEVIATION,0,
                                  (lysp_ext_instance **)(fctx.ext_set.field_2.dnodes + 4));
          }
          else {
            if (dev._4_4_ != LY_STMT_REFERENCE) {
              if (deviations_local == (lysp_deviation **)0x0) {
                local_e8 = (ly_ctx *)0x0;
              }
              else {
                local_e8 = *(ly_ctx **)
                            **(undefined8 **)
                              (deviations_local[7]->dsc +
                              (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
              }
              pcVar1 = lyplg_ext_stmt2str(dev._4_4_);
              ly_vlog(local_e8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar1,"deviation");
              buf._4_4_ = LY_EVALID;
              goto LAB_001cb6f5;
            }
            buf._4_4_ = parse_text_field((lysp_yang_ctx *)deviations_local,
                                         fctx.ext_set.field_2.dnodes[2],LY_STMT_REFERENCE,0,
                                         (char **)(fctx.ext_set.field_2.dnodes + 2),Y_STR_ARG,
                                         (uint16_t *)0x0,
                                         (lysp_ext_instance **)(fctx.ext_set.field_2.dnodes + 4));
          }
          if (buf._4_4_ != LY_SUCCESS) goto LAB_001cb6f5;
          buf._4_4_ = 0;
          buf._4_4_ = get_keyword((lysp_yang_ctx *)deviations_local,(ly_stmt *)((long)&dev + 4),
                                  (char **)&word_len,&stack0xffffffffffffffc0);
          if (buf._4_4_ != LY_SUCCESS) goto LAB_001cb6f5;
          if (dev._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
            if ((fctx.ext_set.field_2.dnodes[4] != (lyd_node *)0x0) &&
               (buf._4_4_ = ly_set_add((ly_set *)(deviations_local[8] + 1),
                                       fctx.ext_set.field_2.dnodes[4],'\x01',(uint32_t *)0x0),
               buf._4_4_ != LY_SUCCESS)) goto LAB_001cb6f5;
            local_79 = true;
          }
        }
        if (fctx.ext_set.field_2.dnodes[3] == (lyd_node *)0x0) {
          if (deviations_local == (lysp_deviation **)0x0) {
            local_f8 = (ly_ctx *)0x0;
          }
          else {
            local_f8 = *(ly_ctx **)
                        **(undefined8 **)
                          (deviations_local[7]->dsc +
                          (ulong)(*(int *)((long)&deviations_local[7]->nodeid + 4) - 1) * 8);
          }
          ly_vlog(local_f8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing mandatory keyword \"%s\" as a child of \"%s\".","deviate","deviation");
          buf._4_4_ = LY_EVALID;
        }
      }
    }
  }
LAB_001cb6f5:
  if (buf._4_4_ != LY_SUCCESS) {
    lysp_deviation_free((lysf_ctx *)&p__,(lysp_deviation *)fctx.ext_set.field_2.dnodes);
    (*pplStack_20)[-1].exts = (lysp_ext_instance *)((long)&(*pplStack_20)[-1].exts[-1].exts + 7);
    if ((*pplStack_20 == (lysp_deviation *)0x0) ||
       ((*pplStack_20)[-1].exts == (lysp_ext_instance *)0x0)) {
      if (*pplStack_20 != (lysp_deviation *)0x0) {
        free(&(*pplStack_20)[-1].exts);
      }
      *pplStack_20 = (lysp_deviation *)0x0;
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_deviation(struct lysp_yang_ctx *ctx, struct lysp_deviation **deviations)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_deviation *dev;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(ctx)};

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *deviations, dev, LY_EMEM);

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);
    CHECK_NONEMPTY(ctx, word_len, "deviation");
    INSERT_WORD_GOTO(ctx, buf, dev->nodeid, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            ret = parse_text_field(ctx, dev->dsc, LY_STMT_DESCRIPTION, 0, &dev->dsc, Y_STR_ARG, NULL, &dev->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        case LY_STMT_DEVIATE:
            LY_CHECK_GOTO(ret = parse_deviate(ctx, &dev->deviates), cleanup);
            break;
        case LY_STMT_REFERENCE:
            ret = parse_text_field(ctx, dev->ref, LY_STMT_REFERENCE, 0, &dev->ref, Y_STR_ARG, NULL, &dev->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, dev, LY_STMT_DEVIATION, 0, &dev->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "deviation");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, dev->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!dev->deviates) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "deviate", "deviation");
        ret = LY_EVALID;
        goto cleanup;
    }

cleanup:
    if (ret) {
        lysp_deviation_free(&fctx, dev);
        LY_ARRAY_DECREMENT_FREE(*deviations);
    }
    return ret;
}